

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringTest.cpp
# Opt level: O0

void __thiscall StringTest::Test1(StringTest *this)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  allocator<char> local_179;
  string local_178 [32];
  string local_158 [8];
  string t8;
  string t7;
  string t6;
  string local_f0 [8];
  string t5;
  string t4;
  string local_a8 [8];
  string t3;
  string t2;
  allocator<char> local_51;
  string local_50 [8];
  string t1;
  string t;
  StringTest *this_local;
  
  std::__cxx11::string::string((string *)(t1.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"this is t1",&local_51);
  std::allocator<char>::~allocator(&local_51);
  std::__cxx11::string::string((string *)(t3.field_2._M_local_buf + 8),local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"this is t3 ",(allocator<char> *)(t4.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(t4.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)(t5.field_2._M_local_buf + 8),local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_f0,"this is t5    ",0xc,(allocator *)(t6.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(t6.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)(t7.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(t8.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_158);
  std::__cxx11::string::operator=((string *)(t7.field_2._M_local_buf + 8),'a');
  std::__cxx11::string::assign(t8.field_2._M_local_buf + 8,0x10b0f6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_178,"this is t5    ",&local_179);
  std::__cxx11::string::assign(local_158,(ulong)local_178,5);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_179);
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 0) {
    lVar2 = std::__cxx11::string::size();
    if (lVar2 != 0) goto LAB_00106534;
  }
  else {
LAB_00106534:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x81,"default contrutor made non-zero sized string");
  }
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 10) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = strcmp(pcVar3,"this is t1");
    if (iVar1 != 0) goto LAB_00106646;
  }
  else {
LAB_00106646:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x84,"t1 not correct");
  }
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 10) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = strcmp(pcVar3,"this is t1");
    if (iVar1 != 0) goto LAB_00106697;
  }
  else {
LAB_00106697:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x87,"t2 not correct");
  }
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 0xb) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = strcmp(pcVar3,"this is t3 ");
    if (iVar1 != 0) goto LAB_001066ee;
  }
  else {
LAB_001066ee:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x8a,"t3 not correct");
  }
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 0xb) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = strcmp(pcVar3,"this is t3 ");
    if (iVar1 != 0) goto LAB_00106745;
  }
  else {
LAB_00106745:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x8d,"t4 not correct");
  }
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 0xc) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = strcmp(pcVar3,"this is t5  ");
    if (iVar1 != 0) goto LAB_0010679c;
  }
  else {
LAB_0010679c:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x90,"t5 not correct");
  }
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 1) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = strcmp(pcVar3,"a");
    if (iVar1 != 0) goto LAB_001067f3;
  }
  else {
LAB_001067f3:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x93,"t6 not correct");
  }
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 7) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = strcmp(pcVar3,"this is");
    if (iVar1 != 0) goto LAB_0010684a;
  }
  else {
LAB_0010684a:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x96,"t7 not correct");
  }
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 2) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = strcmp(pcVar3,"is");
    if (iVar1 == 0) goto LAB_001068c6;
  }
  TestCase::TestFailedInternal
            (&this->super_TestCase,
             "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
             ,0x99,"t8 not correct");
LAB_001068c6:
  TestCase::TestPassed(&this->super_TestCase);
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string((string *)(t8.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(t7.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string((string *)(t5.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string((string *)(t3.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)(t1.field_2._M_local_buf + 8));
  return;
}

Assistant:

void Test1()
	{
		// test constructors and assignments, requiers that c_str, length and size, be working also.
		string t;
		string t1 = "this is t1";
		string t2 = t1;
		string t3( "this is t3 " );
		string t4( t3 );
		string t5( "this is t5    ", 12 );
		string t6;
		string t7;
		string t8;
		
		t6 = 'a';
		t7.assign( "this is t5    ", 7 );
		t8.assign( "this is t5    ", 5, 2 );
		
		if ( t.length() != 0 || t.size() != 0 )
			TestFailed( "default contrutor made non-zero sized string" );

		if ( t1.length() != 10 || strcmp( t1.c_str(), "this is t1" ) != 0 )
			TestFailed( "t1 not correct" );

		if ( t2.length() != 10 || strcmp( t2.c_str(), "this is t1" ) != 0 )
			TestFailed( "t2 not correct" );

		if ( t3.length() != 11 || strcmp( t3.c_str(), "this is t3 " ) != 0 )
			TestFailed( "t3 not correct" );

		if ( t4.length() != 11 || strcmp( t4.c_str(), "this is t3 " ) != 0 )
			TestFailed( "t4 not correct" );

		if ( t5.length() != 12 || strcmp( t5.c_str(), "this is t5  " ) != 0 )
			TestFailed( "t5 not correct" );

		if ( t6.length() != 1 || strcmp( t6.c_str(), "a" ) != 0 )
			TestFailed( "t6 not correct" );

		if ( t7.length() != 7 || strcmp( t7.c_str(), "this is" ) != 0 )
			TestFailed( "t7 not correct" );
		
		if ( t8.length() != 2 || strcmp( t8.c_str(), "is" ) != 0 )
			TestFailed( "t8 not correct" );

		TestPassed();
	}